

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::LayoutBindingTests::init(LayoutBindingTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  char *pcVar2;
  TestNode *this_00;
  int extraout_EAX;
  int iVar3;
  TestNode *pTVar4;
  TestNode *pTVar5;
  TestNode *pTVar6;
  TestNode *pTVar7;
  SamplerBindingRenderCase *pSVar8;
  ImageBindingRenderCase *pIVar9;
  LayoutBindingRenderCase *pLVar10;
  LayoutBindingNegativeCase *pLVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  long lVar13;
  string local_108;
  TestNode *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  TestNode *local_c0;
  TestNode *local_b8;
  TestNode *local_b0;
  TestNode *local_a8;
  TestNode *local_a0;
  TestNode *local_98;
  TestNode *local_90;
  TestNode *local_88;
  TestNode *local_80;
  TestNode *local_78;
  TestNode *local_70;
  TestNode *local_68;
  long local_60;
  TestNode *local_58;
  TestNode *local_50;
  TestNode *local_48;
  TestNode *local_40;
  TestNode *local_38;
  
  pTVar4 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar4,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sampler",
             "Test sampler layout binding");
  local_68 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_68,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sampler2d",
             "Test sampler2d layout binding");
  local_70 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_70,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sampler3d",
             "Test sampler3d layout binding");
  pTVar5 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar5,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"image",
             "Test image layout binding");
  local_78 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_78,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"image2d",
             "Test image2d layout binding");
  local_80 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_80,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"image3d",
             "Test image3d layout binding");
  local_88 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_88,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"ubo",
             "Test UBO layout binding");
  local_90 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_90,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"ssbo",
             "Test SSBO layout binding");
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"negative",
             "Test layout binding with invalid bindings");
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sampler",
             "Test sampler layout binding with invalid bindings");
  local_98 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_98,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sampler2d",
             "Test sampler2d layout binding with invalid bindings");
  local_a0 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_a0,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"sampler3d",
             "Test sampler3d layout binding with invalid bindings");
  local_58 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_58,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"image",
             "Test image layout binding with invalid bindings");
  local_a8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_a8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"image2d",
             "Test image2d layout binding with invalid bindings");
  local_b0 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_b0,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"image3d",
             "Test image3d layout binding with invalid bindings");
  local_b8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_b8,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"ubo",
             "Test UBO layout binding with invalid bindings");
  local_c0 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)local_c0,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"ssbo",
             "Test SSBO layout binding with invalid bindings");
  local_e8 = (TestNode *)this;
  if (init()::s_renderTestTypes == '\0') {
    iVar3 = __cxa_guard_acquire(&init()::s_renderTestTypes);
    if (iVar3 != 0) {
      init::s_renderTestTypes[0].shaderType = SHADERTYPE_VERTEX;
      init::s_renderTestTypes[0].testType = TESTTYPE_BINDING_SINGLE;
      init::s_renderTestTypes[0].name._M_dataplus._M_p =
           (pointer)&init::s_renderTestTypes[0].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_renderTestTypes[0].name,"vertex_binding_single","");
      init::s_renderTestTypes[0].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_renderTestTypes[0].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_renderTestTypes[0].descPostfix,"a single instance","");
      init::s_renderTestTypes[1].shaderType = SHADERTYPE_VERTEX;
      init::s_renderTestTypes[1].testType = TESTTYPE_BINDING_MAX;
      init::s_renderTestTypes[1].name._M_dataplus._M_p =
           (pointer)&init::s_renderTestTypes[1].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_renderTestTypes[1].name,"vertex_binding_max","");
      init::s_renderTestTypes[1].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_renderTestTypes[1].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_renderTestTypes[1].descPostfix,"maximum binding point","");
      init::s_renderTestTypes[2].shaderType = SHADERTYPE_VERTEX;
      init::s_renderTestTypes[2].testType = TESTTYPE_BINDING_MULTIPLE;
      init::s_renderTestTypes[2].name._M_dataplus._M_p =
           (pointer)&init::s_renderTestTypes[2].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_renderTestTypes[2].name,"vertex_binding_multiple","");
      init::s_renderTestTypes[2].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_renderTestTypes[2].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_renderTestTypes[2].descPostfix,"multiple instances","");
      init::s_renderTestTypes[3].shaderType = SHADERTYPE_VERTEX;
      init::s_renderTestTypes[3].testType = TESTTYPE_BINDING_ARRAY;
      init::s_renderTestTypes[3].name._M_dataplus._M_p =
           (pointer)&init::s_renderTestTypes[3].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_renderTestTypes[3].name,"vertex_binding_array","");
      init::s_renderTestTypes[3].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_renderTestTypes[3].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_renderTestTypes[3].descPostfix,"an array instance","");
      init::s_renderTestTypes[4].shaderType = SHADERTYPE_VERTEX;
      init::s_renderTestTypes[4].testType = TESTTYPE_BINDING_MAX_ARRAY;
      init::s_renderTestTypes[4].name._M_dataplus._M_p =
           (pointer)&init::s_renderTestTypes[4].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_renderTestTypes[4].name,"vertex_binding_max_array","");
      init::s_renderTestTypes[4].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_renderTestTypes[4].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_renderTestTypes[4].descPostfix,
                 "an array instance with maximum binding point","");
      init::s_renderTestTypes[5].shaderType = SHADERTYPE_FRAGMENT;
      init::s_renderTestTypes[5].testType = TESTTYPE_BINDING_SINGLE;
      init::s_renderTestTypes[5].name._M_dataplus._M_p =
           (pointer)&init::s_renderTestTypes[5].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_renderTestTypes[5].name,"fragment_binding_single","");
      init::s_renderTestTypes[5].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_renderTestTypes[5].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_renderTestTypes[5].descPostfix,"a single instance","");
      init::s_renderTestTypes[6].shaderType = SHADERTYPE_FRAGMENT;
      init::s_renderTestTypes[6].testType = TESTTYPE_BINDING_MAX;
      init::s_renderTestTypes[6].name._M_dataplus._M_p =
           (pointer)&init::s_renderTestTypes[6].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_renderTestTypes[6].name,"fragment_binding_max","");
      init::s_renderTestTypes[6].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_renderTestTypes[6].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_renderTestTypes[6].descPostfix,"maximum binding point","");
      init::s_renderTestTypes[7].shaderType = SHADERTYPE_FRAGMENT;
      init::s_renderTestTypes[7].testType = TESTTYPE_BINDING_MULTIPLE;
      init::s_renderTestTypes[7].name._M_dataplus._M_p =
           (pointer)&init::s_renderTestTypes[7].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_renderTestTypes[7].name,"fragment_binding_multiple","");
      init::s_renderTestTypes[7].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_renderTestTypes[7].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_renderTestTypes[7].descPostfix,"multiple instances","");
      init::s_renderTestTypes[8].shaderType = SHADERTYPE_FRAGMENT;
      init::s_renderTestTypes[8].testType = TESTTYPE_BINDING_ARRAY;
      init::s_renderTestTypes[8].name._M_dataplus._M_p =
           (pointer)&init::s_renderTestTypes[8].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_renderTestTypes[8].name,"fragment_binding_array","");
      init::s_renderTestTypes[8].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_renderTestTypes[8].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_renderTestTypes[8].descPostfix,"an array instance","");
      init::s_renderTestTypes[9].shaderType = SHADERTYPE_FRAGMENT;
      init::s_renderTestTypes[9].testType = TESTTYPE_BINDING_MAX_ARRAY;
      init::s_renderTestTypes[9].name._M_dataplus._M_p =
           (pointer)&init::s_renderTestTypes[9].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_renderTestTypes[9].name,"fragment_binding_max_array","");
      init::s_renderTestTypes[9].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_renderTestTypes[9].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_renderTestTypes[9].descPostfix,
                 "an array instance with maximum binding point","");
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&init()::s_renderTestTypes);
      this = (LayoutBindingTests *)local_e8;
    }
  }
  local_50 = pTVar7;
  local_48 = pTVar6;
  local_40 = pTVar5;
  local_38 = pTVar4;
  if (init()::s_negativeTestTypes == '\0') {
    iVar3 = __cxa_guard_acquire(&init()::s_negativeTestTypes);
    if (iVar3 != 0) {
      init::s_negativeTestTypes[0].shaderType = SHADERTYPE_VERTEX;
      init::s_negativeTestTypes[0].testType = TESTTYPE_BINDING_SINGLE;
      init::s_negativeTestTypes[0].errorType = ERRORTYPE_OVER_MAX_UNITS;
      init::s_negativeTestTypes[0].name._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[0].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[0].name,"vertex_binding_over_max","");
      init::s_negativeTestTypes[0].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[0].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[0].descPostfix,"over maximum binding point",""
                );
      init::s_negativeTestTypes[1].shaderType = SHADERTYPE_FRAGMENT;
      init::s_negativeTestTypes[1].testType = TESTTYPE_BINDING_SINGLE;
      init::s_negativeTestTypes[1].errorType = ERRORTYPE_OVER_MAX_UNITS;
      init::s_negativeTestTypes[1].name._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[1].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[1].name,"fragment_binding_over_max","");
      init::s_negativeTestTypes[1].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[1].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[1].descPostfix,"over maximum binding point",""
                );
      init::s_negativeTestTypes[2].shaderType = SHADERTYPE_TESS_CONTROL;
      init::s_negativeTestTypes[2].testType = TESTTYPE_BINDING_SINGLE;
      init::s_negativeTestTypes[2].errorType = ERRORTYPE_OVER_MAX_UNITS;
      init::s_negativeTestTypes[2].name._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[2].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[2].name,"tess_control_binding_over_max","");
      init::s_negativeTestTypes[2].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[2].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[2].descPostfix,"over maximum binding point",""
                );
      init::s_negativeTestTypes[3].shaderType = SHADERTYPE_TESS_EVALUATION;
      init::s_negativeTestTypes[3].testType = TESTTYPE_BINDING_SINGLE;
      init::s_negativeTestTypes[3].errorType = ERRORTYPE_OVER_MAX_UNITS;
      init::s_negativeTestTypes[3].name._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[3].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[3].name,"tess_evaluation_binding_over_max","")
      ;
      init::s_negativeTestTypes[3].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[3].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[3].descPostfix,"over maximum binding point",""
                );
      init::s_negativeTestTypes[4].shaderType = SHADERTYPE_VERTEX;
      init::s_negativeTestTypes[4].testType = TESTTYPE_BINDING_SINGLE;
      init::s_negativeTestTypes[4].errorType = ERRORTYPE_LESS_THAN_ZERO;
      init::s_negativeTestTypes[4].name._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[4].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[4].name,"vertex_binding_neg","");
      init::s_negativeTestTypes[4].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[4].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[4].descPostfix,"negative binding point","");
      init::s_negativeTestTypes[5].shaderType = SHADERTYPE_FRAGMENT;
      init::s_negativeTestTypes[5].testType = TESTTYPE_BINDING_SINGLE;
      init::s_negativeTestTypes[5].errorType = ERRORTYPE_LESS_THAN_ZERO;
      init::s_negativeTestTypes[5].name._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[5].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[5].name,"fragment_binding_neg","");
      init::s_negativeTestTypes[5].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[5].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[5].descPostfix,"negative binding point","");
      init::s_negativeTestTypes[6].shaderType = SHADERTYPE_TESS_CONTROL;
      init::s_negativeTestTypes[6].testType = TESTTYPE_BINDING_SINGLE;
      init::s_negativeTestTypes[6].errorType = ERRORTYPE_LESS_THAN_ZERO;
      init::s_negativeTestTypes[6].name._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[6].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[6].name,"tess_control_binding_neg","");
      init::s_negativeTestTypes[6].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[6].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[6].descPostfix,"negative binding point","");
      init::s_negativeTestTypes[7].shaderType = SHADERTYPE_TESS_EVALUATION;
      init::s_negativeTestTypes[7].testType = TESTTYPE_BINDING_SINGLE;
      init::s_negativeTestTypes[7].errorType = ERRORTYPE_LESS_THAN_ZERO;
      init::s_negativeTestTypes[7].name._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[7].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[7].name,"tess_evaluation_binding_neg","");
      init::s_negativeTestTypes[7].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[7].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[7].descPostfix,"negative binding point","");
      init::s_negativeTestTypes[8].shaderType = SHADERTYPE_VERTEX;
      init::s_negativeTestTypes[8].testType = TESTTYPE_BINDING_ARRAY;
      init::s_negativeTestTypes[8].errorType = ERRORTYPE_OVER_MAX_UNITS;
      init::s_negativeTestTypes[8].name._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[8].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[8].name,"vertex_binding_over_max_array","");
      init::s_negativeTestTypes[8].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[8].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[8].descPostfix,"over maximum binding point",""
                );
      init::s_negativeTestTypes[9].shaderType = SHADERTYPE_FRAGMENT;
      init::s_negativeTestTypes[9].testType = TESTTYPE_BINDING_ARRAY;
      init::s_negativeTestTypes[9].errorType = ERRORTYPE_OVER_MAX_UNITS;
      init::s_negativeTestTypes[9].name._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[9].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[9].name,"fragment_binding_over_max_array","");
      init::s_negativeTestTypes[9].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[9].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[9].descPostfix,"over maximum binding point",""
                );
      init::s_negativeTestTypes[10].shaderType = SHADERTYPE_TESS_CONTROL;
      init::s_negativeTestTypes[10].testType = TESTTYPE_BINDING_ARRAY;
      init::s_negativeTestTypes[10].errorType = ERRORTYPE_OVER_MAX_UNITS;
      init::s_negativeTestTypes[10].name._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[10].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[10].name,"tess_control_binding_over_max_array"
                 ,"");
      init::s_negativeTestTypes[10].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[10].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[10].descPostfix,"over maximum binding point",
                 "");
      init::s_negativeTestTypes[0xb].shaderType = SHADERTYPE_TESS_EVALUATION;
      init::s_negativeTestTypes[0xb].testType = TESTTYPE_BINDING_ARRAY;
      init::s_negativeTestTypes[0xb].errorType = ERRORTYPE_OVER_MAX_UNITS;
      init::s_negativeTestTypes[0xb].name._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[0xb].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[0xb].name,
                 "tess_evaluation_binding_over_max_array","");
      init::s_negativeTestTypes[0xb].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[0xb].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[0xb].descPostfix,"over maximum binding point",
                 "");
      init::s_negativeTestTypes[0xc].shaderType = SHADERTYPE_VERTEX;
      init::s_negativeTestTypes[0xc].testType = TESTTYPE_BINDING_ARRAY;
      init::s_negativeTestTypes[0xc].errorType = ERRORTYPE_LESS_THAN_ZERO;
      init::s_negativeTestTypes[0xc].name._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[0xc].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[0xc].name,"vertex_binding_neg_array","");
      init::s_negativeTestTypes[0xc].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[0xc].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[0xc].descPostfix,"negative binding point","");
      init::s_negativeTestTypes[0xd].shaderType = SHADERTYPE_FRAGMENT;
      init::s_negativeTestTypes[0xd].testType = TESTTYPE_BINDING_ARRAY;
      init::s_negativeTestTypes[0xd].errorType = ERRORTYPE_LESS_THAN_ZERO;
      init::s_negativeTestTypes[0xd].name._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[0xd].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[0xd].name,"fragment_binding_neg_array","");
      init::s_negativeTestTypes[0xd].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[0xd].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[0xd].descPostfix,"negative binding point","");
      init::s_negativeTestTypes[0xe].shaderType = SHADERTYPE_TESS_CONTROL;
      init::s_negativeTestTypes[0xe].testType = TESTTYPE_BINDING_ARRAY;
      init::s_negativeTestTypes[0xe].errorType = ERRORTYPE_LESS_THAN_ZERO;
      init::s_negativeTestTypes[0xe].name._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[0xe].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[0xe].name,"tess_control_binding_neg_array","")
      ;
      init::s_negativeTestTypes[0xe].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[0xe].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[0xe].descPostfix,"negative binding point","");
      init::s_negativeTestTypes[0xf].shaderType = SHADERTYPE_TESS_EVALUATION;
      init::s_negativeTestTypes[0xf].testType = TESTTYPE_BINDING_ARRAY;
      init::s_negativeTestTypes[0xf].errorType = ERRORTYPE_LESS_THAN_ZERO;
      init::s_negativeTestTypes[0xf].name._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[0xf].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[0xf].name,"tess_evaluation_binding_neg_array",
                 "");
      init::s_negativeTestTypes[0xf].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[0xf].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[0xf].descPostfix,"negative binding point","");
      init::s_negativeTestTypes[0x10].shaderType = SHADERTYPE_ALL;
      init::s_negativeTestTypes[0x10].testType = TESTTYPE_BINDING_SINGLE;
      init::s_negativeTestTypes[0x10].errorType = ERRORTYPE_CONTRADICTORY;
      init::s_negativeTestTypes[0x10].name._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[0x10].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[0x10].name,"binding_contradictory","");
      init::s_negativeTestTypes[0x10].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[0x10].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[0x10].descPostfix,
                 "contradictory binding points","");
      init::s_negativeTestTypes[0x11].shaderType = SHADERTYPE_ALL;
      init::s_negativeTestTypes[0x11].testType = TESTTYPE_BINDING_ARRAY;
      init::s_negativeTestTypes[0x11].errorType = ERRORTYPE_CONTRADICTORY;
      init::s_negativeTestTypes[0x11].name._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[0x11].name.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[0x11].name,"binding_contradictory_array","");
      init::s_negativeTestTypes[0x11].descPostfix._M_dataplus._M_p =
           (pointer)&init::s_negativeTestTypes[0x11].descPostfix.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&init::s_negativeTestTypes[0x11].descPostfix,
                 "contradictory binding points","");
      __cxa_atexit(__cxx_global_array_dtor_64,0,&__dso_handle);
      __cxa_guard_release(&init()::s_negativeTestTypes);
      this = (LayoutBindingTests *)local_e8;
    }
  }
  pbVar12 = &init::s_renderTestTypes[0].descPostfix;
  local_60 = 10;
  do {
    pSVar8 = (SamplerBindingRenderCase *)operator_new(0x120);
    pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    pcVar2 = pbVar12[-1]._M_dataplus._M_p;
    std::operator+(&local_108,"Sampler2D layout binding with ",pbVar12);
    anon_unknown_1::SamplerBindingRenderCase::SamplerBindingRenderCase
              (pSVar8,pCVar1,pcVar2,local_108._M_dataplus._M_p,
               *(ShaderType *)((long)&pbVar12[-2].field_2 + 8),
               *(TestType *)((long)&pbVar12[-2].field_2 + 0xc),0x8b5e,0xde1);
    tcu::TestNode::addChild(local_68,(TestNode *)pSVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT17(local_108.field_2._M_local_buf[7],
                               local_108.field_2._M_allocated_capacity._0_7_) + 1);
    }
    pSVar8 = (SamplerBindingRenderCase *)operator_new(0x120);
    pCVar1 = (Context *)local_e8[1]._vptr_TestNode;
    pcVar2 = pbVar12[-1]._M_dataplus._M_p;
    std::operator+(&local_108,"Sampler3D layout binding with ",pbVar12);
    anon_unknown_1::SamplerBindingRenderCase::SamplerBindingRenderCase
              (pSVar8,pCVar1,pcVar2,local_108._M_dataplus._M_p,
               *(ShaderType *)((long)&pbVar12[-2].field_2 + 8),
               *(TestType *)((long)&pbVar12[-2].field_2 + 0xc),0x8b5f,0x806f);
    tcu::TestNode::addChild(local_70,(TestNode *)pSVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT17(local_108.field_2._M_local_buf[7],
                               local_108.field_2._M_allocated_capacity._0_7_) + 1);
    }
    pIVar9 = (ImageBindingRenderCase *)operator_new(0x120);
    pCVar1 = (Context *)local_e8[1]._vptr_TestNode;
    pcVar2 = pbVar12[-1]._M_dataplus._M_p;
    std::operator+(&local_108,"Image2D layout binding with ",pbVar12);
    anon_unknown_1::ImageBindingRenderCase::ImageBindingRenderCase
              (pIVar9,pCVar1,pcVar2,local_108._M_dataplus._M_p,
               *(ShaderType *)((long)&pbVar12[-2].field_2 + 8),
               *(TestType *)((long)&pbVar12[-2].field_2 + 0xc),0x904d,0xde1);
    tcu::TestNode::addChild(local_78,(TestNode *)pIVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT17(local_108.field_2._M_local_buf[7],
                               local_108.field_2._M_allocated_capacity._0_7_) + 1);
    }
    pIVar9 = (ImageBindingRenderCase *)operator_new(0x120);
    pCVar1 = (Context *)local_e8[1]._vptr_TestNode;
    pcVar2 = pbVar12[-1]._M_dataplus._M_p;
    std::operator+(&local_108,"Image3D layout binding with ",pbVar12);
    anon_unknown_1::ImageBindingRenderCase::ImageBindingRenderCase
              (pIVar9,pCVar1,pcVar2,local_108._M_dataplus._M_p,
               *(ShaderType *)((long)&pbVar12[-2].field_2 + 8),
               *(TestType *)((long)&pbVar12[-2].field_2 + 0xc),0x904e,0x806f);
    tcu::TestNode::addChild(local_80,(TestNode *)pIVar9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT17(local_108.field_2._M_local_buf[7],
                               local_108.field_2._M_allocated_capacity._0_7_) + 1);
    }
    pLVar10 = (LayoutBindingRenderCase *)operator_new(0x118);
    this = (LayoutBindingTests *)local_e8;
    pCVar1 = (Context *)local_e8[1]._vptr_TestNode;
    pcVar2 = pbVar12[-1]._M_dataplus._M_p;
    std::operator+(&local_e0,"UBO layout binding with ",pbVar12);
    local_108.field_2._M_allocated_capacity._0_7_ = 0x6c42726f6c6f43;
    local_108.field_2._M_local_buf[7] = 'o';
    local_108.field_2._8_2_ = 0x6b63;
    local_108._M_string_length = 10;
    local_108.field_2._M_local_buf[10] = '\0';
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    anon_unknown_1::LayoutBindingRenderCase::LayoutBindingRenderCase
              (pLVar10,pCVar1,pcVar2,local_e0._M_dataplus._M_p,
               *(ShaderType *)((long)&pbVar12[-2].field_2 + 8),
               *(TestType *)((long)&pbVar12[-2].field_2 + 0xc),0x8a2f,0x8a2b,0x8a2d,0x8a2e,
               &local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT17(local_108.field_2._M_local_buf[7],
                               local_108.field_2._M_allocated_capacity._0_7_) + 1);
    }
    (pLVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__UBOBindingRenderCase_00b499f0;
    pLVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
    pLVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
    pLVar10[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
    pLVar10[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
    pLVar10[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0
    ;
    *(undefined8 *)
     ((long)&pLVar10[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
    tcu::TestNode::addChild(local_88,(TestNode *)pLVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    pLVar10 = (LayoutBindingRenderCase *)operator_new(0x118);
    pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    pcVar2 = pbVar12[-1]._M_dataplus._M_p;
    std::operator+(&local_e0,"SSBO layout binding with ",pbVar12);
    local_108.field_2._M_allocated_capacity._0_7_ = 0x7542726f6c6f43;
    local_108.field_2._M_local_buf[7] = 'f';
    local_108.field_2._8_2_ = 0x6566;
    local_108.field_2._M_local_buf[10] = 'r';
    local_108._M_string_length = 0xb;
    local_108.field_2._M_local_buf[0xb] = '\0';
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    anon_unknown_1::LayoutBindingRenderCase::LayoutBindingRenderCase
              (pLVar10,pCVar1,pcVar2,local_e0._M_dataplus._M_p,
               *(ShaderType *)((long)&pbVar12[-2].field_2 + 8),
               *(TestType *)((long)&pbVar12[-2].field_2 + 0xc),0x90dd,0x90d6,0x90da,0x90dc,
               &local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT17(local_108.field_2._M_local_buf[7],
                               local_108.field_2._M_allocated_capacity._0_7_) + 1);
    }
    (pLVar10->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SSBOBindingRenderCase_00b49a48;
    pLVar10[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
    pLVar10[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
    pLVar10[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p = (pointer)0x0;
    pLVar10[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
    pLVar10[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity = 0
    ;
    *(undefined8 *)
     ((long)&pLVar10[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
    tcu::TestNode::addChild(local_90,(TestNode *)pLVar10);
    lVar13 = local_60;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &pbVar12[2]._M_string_length;
    local_60 = lVar13 + -1;
  } while (local_60 != 0);
  pbVar12 = &init::s_negativeTestTypes[0].descPostfix;
  lVar13 = 0x12;
  do {
    local_60 = lVar13;
    pTVar4 = (TestNode *)operator_new(0x138);
    pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    pcVar2 = pbVar12[-1]._M_dataplus._M_p;
    std::operator+(&local_108,"Invalid sampler2d layout binding using ",pbVar12);
    anon_unknown_1::SamplerBindingNegativeCase::SamplerBindingNegativeCase
              ((SamplerBindingNegativeCase *)pTVar4,pCVar1,pcVar2,local_108._M_dataplus._M_p,
               *(ShaderType *)&pbVar12[-2].field_2,*(TestType *)((long)&pbVar12[-2].field_2 + 4),
               *(ErrorType *)((long)&pbVar12[-2].field_2 + 8),0x8b5e);
    tcu::TestNode::addChild(local_98,pTVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT17(local_108.field_2._M_local_buf[7],
                               local_108.field_2._M_allocated_capacity._0_7_) + 1);
    }
    pTVar4 = (TestNode *)operator_new(0x138);
    pCVar1 = (Context *)local_e8[1]._vptr_TestNode;
    pcVar2 = pbVar12[-1]._M_dataplus._M_p;
    std::operator+(&local_108,"Invalid sampler3d layout binding using ",pbVar12);
    anon_unknown_1::SamplerBindingNegativeCase::SamplerBindingNegativeCase
              ((SamplerBindingNegativeCase *)pTVar4,pCVar1,pcVar2,local_108._M_dataplus._M_p,
               *(ShaderType *)&pbVar12[-2].field_2,*(TestType *)((long)&pbVar12[-2].field_2 + 4),
               *(ErrorType *)((long)&pbVar12[-2].field_2 + 8),0x8b5f);
    tcu::TestNode::addChild(local_a0,pTVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT17(local_108.field_2._M_local_buf[7],
                               local_108.field_2._M_allocated_capacity._0_7_) + 1);
    }
    pTVar4 = (TestNode *)operator_new(0x138);
    pCVar1 = (Context *)local_e8[1]._vptr_TestNode;
    pcVar2 = pbVar12[-1]._M_dataplus._M_p;
    std::operator+(&local_108,"Invalid image2d layout binding using ",pbVar12);
    anon_unknown_1::ImageBindingNegativeCase::ImageBindingNegativeCase
              ((ImageBindingNegativeCase *)pTVar4,pCVar1,pcVar2,local_108._M_dataplus._M_p,
               *(ShaderType *)&pbVar12[-2].field_2,*(TestType *)((long)&pbVar12[-2].field_2 + 4),
               *(ErrorType *)((long)&pbVar12[-2].field_2 + 8),0x904d);
    tcu::TestNode::addChild(local_a8,pTVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT17(local_108.field_2._M_local_buf[7],
                               local_108.field_2._M_allocated_capacity._0_7_) + 1);
    }
    pTVar4 = (TestNode *)operator_new(0x138);
    pCVar1 = (Context *)local_e8[1]._vptr_TestNode;
    pcVar2 = pbVar12[-1]._M_dataplus._M_p;
    std::operator+(&local_108,"Invalid image3d layout binding using ",pbVar12);
    anon_unknown_1::ImageBindingNegativeCase::ImageBindingNegativeCase
              ((ImageBindingNegativeCase *)pTVar4,pCVar1,pcVar2,local_108._M_dataplus._M_p,
               *(ShaderType *)&pbVar12[-2].field_2,*(TestType *)((long)&pbVar12[-2].field_2 + 4),
               *(ErrorType *)((long)&pbVar12[-2].field_2 + 8),0x904e);
    tcu::TestNode::addChild(local_b0,pTVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT17(local_108.field_2._M_local_buf[7],
                               local_108.field_2._M_allocated_capacity._0_7_) + 1);
    }
    pLVar11 = (LayoutBindingNegativeCase *)operator_new(0x138);
    this = (LayoutBindingTests *)local_e8;
    pCVar1 = (Context *)local_e8[1]._vptr_TestNode;
    pcVar2 = pbVar12[-1]._M_dataplus._M_p;
    std::operator+(&local_e0,"Invalid UBO layout binding using ",pbVar12);
    local_108.field_2._M_allocated_capacity._0_7_ = 0x6c42726f6c6f43;
    local_108.field_2._M_local_buf[7] = 'o';
    local_108.field_2._8_2_ = 0x6b63;
    local_108._M_string_length = 10;
    local_108.field_2._M_local_buf[10] = '\0';
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    anon_unknown_1::LayoutBindingNegativeCase::LayoutBindingNegativeCase
              (pLVar11,pCVar1,pcVar2,local_e0._M_dataplus._M_p,*(ShaderType *)&pbVar12[-2].field_2,
               *(TestType *)((long)&pbVar12[-2].field_2 + 4),
               *(ErrorType *)((long)&pbVar12[-2].field_2 + 8),0x8a2f,0x8a2b,0x8e89,0x8e8a,0x8a2d,
               0x8a2e,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT17(local_108.field_2._M_local_buf[7],
                               local_108.field_2._M_allocated_capacity._0_7_) + 1);
    }
    (pLVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__UBOBindingNegativeCase_00b49ba8;
    tcu::TestNode::addChild(local_b8,(TestNode *)pLVar11);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    pLVar11 = (LayoutBindingNegativeCase *)operator_new(0x138);
    pCVar1 = (Context *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    pcVar2 = pbVar12[-1]._M_dataplus._M_p;
    std::operator+(&local_e0,"Invalid SSBO layout binding using ",pbVar12);
    local_108.field_2._M_allocated_capacity._0_7_ = 0x7542726f6c6f43;
    local_108.field_2._M_local_buf[7] = 'f';
    local_108.field_2._8_2_ = 0x6566;
    local_108.field_2._M_local_buf[10] = 'r';
    local_108._M_string_length = 0xb;
    local_108.field_2._M_local_buf[0xb] = '\0';
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    anon_unknown_1::LayoutBindingNegativeCase::LayoutBindingNegativeCase
              (pLVar11,pCVar1,pcVar2,local_e0._M_dataplus._M_p,*(ShaderType *)&pbVar12[-2].field_2,
               *(TestType *)((long)&pbVar12[-2].field_2 + 4),
               *(ErrorType *)((long)&pbVar12[-2].field_2 + 8),0x90dd,0x90d6,0x90d8,0x90d9,0x90da,
               0x90dc,&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,
                      CONCAT17(local_108.field_2._M_local_buf[7],
                               local_108.field_2._M_allocated_capacity._0_7_) + 1);
    }
    (pLVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__SSBOBindingNegativeCase_00b49c00;
    tcu::TestNode::addChild(local_c0,(TestNode *)pLVar11);
    lVar13 = local_60;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    pTVar4 = local_38;
    pbVar12 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &pbVar12[2].field_2;
    lVar13 = lVar13 + -1;
  } while (lVar13 != 0);
  tcu::TestNode::addChild(local_38,local_68);
  tcu::TestNode::addChild(pTVar4,local_70);
  this_00 = local_40;
  tcu::TestNode::addChild(local_40,local_78);
  tcu::TestNode::addChild(this_00,local_80);
  pTVar6 = local_50;
  tcu::TestNode::addChild(local_50,local_98);
  tcu::TestNode::addChild(pTVar6,local_a0);
  pTVar5 = local_58;
  tcu::TestNode::addChild(local_58,local_a8);
  tcu::TestNode::addChild(pTVar5,local_b0);
  pTVar7 = local_48;
  tcu::TestNode::addChild(local_48,pTVar6);
  tcu::TestNode::addChild(pTVar7,local_b8);
  tcu::TestNode::addChild(pTVar7,local_c0);
  tcu::TestNode::addChild(pTVar7,pTVar5);
  tcu::TestNode::addChild((TestNode *)this,pTVar4);
  tcu::TestNode::addChild((TestNode *)this,local_88);
  tcu::TestNode::addChild((TestNode *)this,local_90);
  tcu::TestNode::addChild((TestNode *)this,this_00);
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  return extraout_EAX;
}

Assistant:

void LayoutBindingTests::init (void)
{
	// Render test groups
	tcu::TestCaseGroup* const samplerBindingTestGroup			= new tcu::TestCaseGroup(m_testCtx, "sampler",		"Test sampler layout binding");
	tcu::TestCaseGroup* const sampler2dBindingTestGroup			= new tcu::TestCaseGroup(m_testCtx, "sampler2d",	"Test sampler2d layout binding");
	tcu::TestCaseGroup* const sampler3dBindingTestGroup			= new tcu::TestCaseGroup(m_testCtx, "sampler3d",	"Test sampler3d layout binding");

	tcu::TestCaseGroup* const imageBindingTestGroup				= new tcu::TestCaseGroup(m_testCtx, "image",		"Test image layout binding");
	tcu::TestCaseGroup* const image2dBindingTestGroup			= new tcu::TestCaseGroup(m_testCtx, "image2d",		"Test image2d layout binding");
	tcu::TestCaseGroup* const image3dBindingTestGroup			= new tcu::TestCaseGroup(m_testCtx, "image3d",		"Test image3d layout binding");

	tcu::TestCaseGroup* const UBOBindingTestGroup				= new tcu::TestCaseGroup(m_testCtx, "ubo",			"Test UBO layout binding");
	tcu::TestCaseGroup* const SSBOBindingTestGroup				= new tcu::TestCaseGroup(m_testCtx, "ssbo",			"Test SSBO layout binding");

	// Negative test groups
	tcu::TestCaseGroup* const negativeBindingTestGroup			= new tcu::TestCaseGroup(m_testCtx, "negative",		"Test layout binding with invalid bindings");

	tcu::TestCaseGroup* const negativeSamplerBindingTestGroup	= new tcu::TestCaseGroup(m_testCtx, "sampler",		"Test sampler layout binding with invalid bindings");
	tcu::TestCaseGroup* const negativeSampler2dBindingTestGroup	= new tcu::TestCaseGroup(m_testCtx, "sampler2d",	"Test sampler2d layout binding with invalid bindings");
	tcu::TestCaseGroup* const negativeSampler3dBindingTestGroup	= new tcu::TestCaseGroup(m_testCtx, "sampler3d",	"Test sampler3d layout binding with invalid bindings");

	tcu::TestCaseGroup* const negativeImageBindingTestGroup		= new tcu::TestCaseGroup(m_testCtx, "image",		"Test image layout binding with invalid bindings");
	tcu::TestCaseGroup* const negativeImage2dBindingTestGroup	= new tcu::TestCaseGroup(m_testCtx, "image2d",		"Test image2d layout binding with invalid bindings");
	tcu::TestCaseGroup* const negativeImage3dBindingTestGroup	= new tcu::TestCaseGroup(m_testCtx, "image3d",		"Test image3d layout binding with invalid bindings");

	tcu::TestCaseGroup* const negativeUBOBindingTestGroup		= new tcu::TestCaseGroup(m_testCtx, "ubo",			"Test UBO layout binding with invalid bindings");
	tcu::TestCaseGroup* const negativeSSBOBindingTestGroup		= new tcu::TestCaseGroup(m_testCtx, "ssbo",			"Test SSBO layout binding with invalid bindings");

	static const struct RenderTestType
	{
		ShaderType				shaderType;
		TestType				testType;
		std::string				name;
		std::string				descPostfix;
	} s_renderTestTypes[] =
	{
		{ SHADERTYPE_VERTEX,	TESTTYPE_BINDING_SINGLE,		"vertex_binding_single",		"a single instance" },
		{ SHADERTYPE_VERTEX,	TESTTYPE_BINDING_MAX,			"vertex_binding_max",			"maximum binding point"	},
		{ SHADERTYPE_VERTEX,	TESTTYPE_BINDING_MULTIPLE,		"vertex_binding_multiple",		"multiple instances"},
		{ SHADERTYPE_VERTEX,	TESTTYPE_BINDING_ARRAY,			"vertex_binding_array",			"an array instance" },
		{ SHADERTYPE_VERTEX,	TESTTYPE_BINDING_MAX_ARRAY,		"vertex_binding_max_array",		"an array instance with maximum binding point" },

		{ SHADERTYPE_FRAGMENT,	TESTTYPE_BINDING_SINGLE,		"fragment_binding_single",		"a single instance" },
		{ SHADERTYPE_FRAGMENT,	TESTTYPE_BINDING_MAX,			"fragment_binding_max",			"maximum binding point"	},
		{ SHADERTYPE_FRAGMENT,	TESTTYPE_BINDING_MULTIPLE,		"fragment_binding_multiple",	"multiple instances"},
		{ SHADERTYPE_FRAGMENT,	TESTTYPE_BINDING_ARRAY,			"fragment_binding_array",		"an array instance" },
		{ SHADERTYPE_FRAGMENT,	TESTTYPE_BINDING_MAX_ARRAY,		"fragment_binding_max_array",	"an array instance with maximum binding point" },
	};

	static const struct NegativeTestType
	{
		ShaderType								shaderType;
		TestType								testType;
		LayoutBindingNegativeCase::ErrorType	errorType;
		std::string								name;
		std::string								descPostfix;
	} s_negativeTestTypes[] =
	{
		{ SHADERTYPE_VERTEX,			TESTTYPE_BINDING_SINGLE,		LayoutBindingNegativeCase::ERRORTYPE_OVER_MAX_UNITS,	"vertex_binding_over_max",					"over maximum binding point"   },
		{ SHADERTYPE_FRAGMENT,			TESTTYPE_BINDING_SINGLE,		LayoutBindingNegativeCase::ERRORTYPE_OVER_MAX_UNITS,	"fragment_binding_over_max",				"over maximum binding point"   },
		{ SHADERTYPE_TESS_CONTROL,		TESTTYPE_BINDING_SINGLE,		LayoutBindingNegativeCase::ERRORTYPE_OVER_MAX_UNITS,	"tess_control_binding_over_max",			"over maximum binding point"   },
		{ SHADERTYPE_TESS_EVALUATION,	TESTTYPE_BINDING_SINGLE,		LayoutBindingNegativeCase::ERRORTYPE_OVER_MAX_UNITS,	"tess_evaluation_binding_over_max",			"over maximum binding point"   },
		{ SHADERTYPE_VERTEX,			TESTTYPE_BINDING_SINGLE,		LayoutBindingNegativeCase::ERRORTYPE_LESS_THAN_ZERO,	"vertex_binding_neg",						"negative binding point"	   },
		{ SHADERTYPE_FRAGMENT,			TESTTYPE_BINDING_SINGLE,		LayoutBindingNegativeCase::ERRORTYPE_LESS_THAN_ZERO,	"fragment_binding_neg",						"negative binding point"	   },
		{ SHADERTYPE_TESS_CONTROL,		TESTTYPE_BINDING_SINGLE,		LayoutBindingNegativeCase::ERRORTYPE_LESS_THAN_ZERO,	"tess_control_binding_neg",					"negative binding point"	   },
		{ SHADERTYPE_TESS_EVALUATION,	TESTTYPE_BINDING_SINGLE,		LayoutBindingNegativeCase::ERRORTYPE_LESS_THAN_ZERO,	"tess_evaluation_binding_neg",				"negative binding point"	   },

		{ SHADERTYPE_VERTEX,			TESTTYPE_BINDING_ARRAY,			LayoutBindingNegativeCase::ERRORTYPE_OVER_MAX_UNITS,	"vertex_binding_over_max_array",			"over maximum binding point"   },
		{ SHADERTYPE_FRAGMENT,			TESTTYPE_BINDING_ARRAY,			LayoutBindingNegativeCase::ERRORTYPE_OVER_MAX_UNITS,	"fragment_binding_over_max_array",			"over maximum binding point"   },
		{ SHADERTYPE_TESS_CONTROL,		TESTTYPE_BINDING_ARRAY,			LayoutBindingNegativeCase::ERRORTYPE_OVER_MAX_UNITS,	"tess_control_binding_over_max_array",		"over maximum binding point"   },
		{ SHADERTYPE_TESS_EVALUATION,	TESTTYPE_BINDING_ARRAY,			LayoutBindingNegativeCase::ERRORTYPE_OVER_MAX_UNITS,	"tess_evaluation_binding_over_max_array",	"over maximum binding point"   },
		{ SHADERTYPE_VERTEX,			TESTTYPE_BINDING_ARRAY,			LayoutBindingNegativeCase::ERRORTYPE_LESS_THAN_ZERO,	"vertex_binding_neg_array",					"negative binding point"	   },
		{ SHADERTYPE_FRAGMENT,			TESTTYPE_BINDING_ARRAY,			LayoutBindingNegativeCase::ERRORTYPE_LESS_THAN_ZERO,	"fragment_binding_neg_array",				"negative binding point"	   },
		{ SHADERTYPE_TESS_CONTROL,		TESTTYPE_BINDING_ARRAY,			LayoutBindingNegativeCase::ERRORTYPE_LESS_THAN_ZERO,	"tess_control_binding_neg_array",			"negative binding point"	   },
		{ SHADERTYPE_TESS_EVALUATION,	TESTTYPE_BINDING_ARRAY,			LayoutBindingNegativeCase::ERRORTYPE_LESS_THAN_ZERO,	"tess_evaluation_binding_neg_array",		"negative binding point"	   },

		{ SHADERTYPE_ALL,				TESTTYPE_BINDING_SINGLE,		LayoutBindingNegativeCase::ERRORTYPE_CONTRADICTORY,		"binding_contradictory",					"contradictory binding points" },
		{ SHADERTYPE_ALL,				TESTTYPE_BINDING_ARRAY,			LayoutBindingNegativeCase::ERRORTYPE_CONTRADICTORY,		"binding_contradictory_array",				"contradictory binding points" },
	};

	// Render tests
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(s_renderTestTypes); ++testNdx)
	{
		const RenderTestType& test = s_renderTestTypes[testNdx];

		// Render sampler binding tests
		sampler2dBindingTestGroup->addChild(new SamplerBindingRenderCase(m_context, test.name.c_str(), ("Sampler2D layout binding with " + test.descPostfix).c_str(), test.shaderType, test.testType, GL_SAMPLER_2D, GL_TEXTURE_2D));
		sampler3dBindingTestGroup->addChild(new SamplerBindingRenderCase(m_context, test.name.c_str(), ("Sampler3D layout binding with " + test.descPostfix).c_str(), test.shaderType, test.testType, GL_SAMPLER_3D, GL_TEXTURE_3D));

		// Render image binding tests
		image2dBindingTestGroup->addChild(new ImageBindingRenderCase(m_context, test.name.c_str(), ("Image2D layout binding with " + test.descPostfix).c_str(), test.shaderType, test.testType, GL_IMAGE_2D, GL_TEXTURE_2D));
		image3dBindingTestGroup->addChild(new ImageBindingRenderCase(m_context, test.name.c_str(), ("Image3D layout binding with " + test.descPostfix).c_str(), test.shaderType, test.testType, GL_IMAGE_3D, GL_TEXTURE_3D));

		// Render UBO binding tests
		UBOBindingTestGroup->addChild(new UBOBindingRenderCase(m_context, test.name.c_str(), ("UBO layout binding with " + test.descPostfix).c_str(), test.shaderType, test.testType));

		// Render SSBO binding tests
		SSBOBindingTestGroup->addChild(new SSBOBindingRenderCase(m_context, test.name.c_str(), ("SSBO layout binding with " + test.descPostfix).c_str(), test.shaderType, test.testType));
	}

	// Negative binding tests
	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(s_negativeTestTypes); ++testNdx)
	{
		const NegativeTestType& test = s_negativeTestTypes[testNdx];

		// Negative sampler binding tests
		negativeSampler2dBindingTestGroup->addChild(new SamplerBindingNegativeCase(m_context, test.name.c_str(), ("Invalid sampler2d layout binding using " + test.descPostfix).c_str(), test.shaderType, test.testType, test.errorType, GL_SAMPLER_2D));
		negativeSampler3dBindingTestGroup->addChild(new SamplerBindingNegativeCase(m_context, test.name.c_str(), ("Invalid sampler3d layout binding using " + test.descPostfix).c_str(), test.shaderType, test.testType, test.errorType, GL_SAMPLER_3D));

		// Negative image binding tests
		negativeImage2dBindingTestGroup->addChild(new ImageBindingNegativeCase(m_context, test.name.c_str(), ("Invalid image2d layout binding using " + test.descPostfix).c_str(), test.shaderType, test.testType, test.errorType, GL_IMAGE_2D));
		negativeImage3dBindingTestGroup->addChild(new ImageBindingNegativeCase(m_context, test.name.c_str(), ("Invalid image3d layout binding using " + test.descPostfix).c_str(), test.shaderType, test.testType, test.errorType, GL_IMAGE_3D));

		// Negative UBO binding tests
		negativeUBOBindingTestGroup->addChild(new UBOBindingNegativeCase(m_context, test.name.c_str(), ("Invalid UBO layout binding using " + test.descPostfix).c_str(), test.shaderType, test.testType, test.errorType));

		// Negative SSBO binding tests
		negativeSSBOBindingTestGroup->addChild(new SSBOBindingNegativeCase(m_context, test.name.c_str(), ("Invalid SSBO layout binding using " + test.descPostfix).c_str(), test.shaderType, test.testType, test.errorType));
	}

	samplerBindingTestGroup->addChild(sampler2dBindingTestGroup);
	samplerBindingTestGroup->addChild(sampler3dBindingTestGroup);

	imageBindingTestGroup->addChild(image2dBindingTestGroup);
	imageBindingTestGroup->addChild(image3dBindingTestGroup);

	negativeSamplerBindingTestGroup->addChild(negativeSampler2dBindingTestGroup);
	negativeSamplerBindingTestGroup->addChild(negativeSampler3dBindingTestGroup);

	negativeImageBindingTestGroup->addChild(negativeImage2dBindingTestGroup);
	negativeImageBindingTestGroup->addChild(negativeImage3dBindingTestGroup);

	negativeBindingTestGroup->addChild(negativeSamplerBindingTestGroup);
	negativeBindingTestGroup->addChild(negativeUBOBindingTestGroup);
	negativeBindingTestGroup->addChild(negativeSSBOBindingTestGroup);
	negativeBindingTestGroup->addChild(negativeImageBindingTestGroup);

	addChild(samplerBindingTestGroup);
	addChild(UBOBindingTestGroup);
	addChild(SSBOBindingTestGroup);
	addChild(imageBindingTestGroup);
	addChild(negativeBindingTestGroup);
}